

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

xmlBufPtr xmlBufCreate(void)

{
  xmlBufPtr buf;
  int *piVar1;
  uint *puVar2;
  xmlBufferAllocationScheme *pxVar3;
  xmlChar *pxVar4;
  
  buf = (xmlBufPtr)(*xmlMalloc)(0x40);
  if (buf == (xmlBufPtr)0x0) {
    buf = (xmlBufPtr)0x0;
    xmlBufMemoryError((xmlBufPtr)0x0,"creating buffer");
  }
  else {
    buf->compat_use = 0;
    buf->use = 0;
    buf->error = 0;
    buf->buffer = (xmlBufferPtr)0x0;
    piVar1 = __xmlDefaultBufferSize();
    buf->size = (long)*piVar1;
    puVar2 = (uint *)__xmlDefaultBufferSize();
    buf->compat_size = *puVar2;
    pxVar3 = __xmlBufferAllocScheme();
    buf->alloc = *pxVar3;
    pxVar4 = (xmlChar *)(*xmlMallocAtomic)(buf->size);
    buf->content = pxVar4;
    if (pxVar4 == (xmlChar *)0x0) {
      xmlBufMemoryError(buf,"creating buffer");
      (*xmlFree)(buf);
      buf = (xmlBufPtr)0x0;
    }
    else {
      *pxVar4 = '\0';
      buf->contentIO = (xmlChar *)0x0;
    }
  }
  return buf;
}

Assistant:

xmlBufPtr
xmlBufCreate(void) {
    xmlBufPtr ret;

    ret = (xmlBufPtr) xmlMalloc(sizeof(xmlBuf));
    if (ret == NULL) {
	xmlBufMemoryError(NULL, "creating buffer");
        return(NULL);
    }
    ret->compat_use = 0;
    ret->use = 0;
    ret->error = 0;
    ret->buffer = NULL;
    ret->size = xmlDefaultBufferSize;
    ret->compat_size = xmlDefaultBufferSize;
    ret->alloc = xmlBufferAllocScheme;
    ret->content = (xmlChar *) xmlMallocAtomic(ret->size * sizeof(xmlChar));
    if (ret->content == NULL) {
	xmlBufMemoryError(ret, "creating buffer");
	xmlFree(ret);
        return(NULL);
    }
    ret->content[0] = 0;
    ret->contentIO = NULL;
    return(ret);
}